

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O3

uint8_t * __thiscall arangodb::velocypack::Builder::set(Builder *this,Value *item)

{
  ValueLength *pVVar1;
  double dVar2;
  ValueType VVar3;
  CType CVar4;
  ValueLength VVar5;
  pointer pCVar6;
  ValueLength VVar7;
  bool bVar8;
  long lVar9;
  ValueUnion VVar10;
  size_t v;
  Exception *this_00;
  ulong uVar11;
  char *pcVar12;
  ExceptionType EVar13;
  uint64_t v_00;
  uint8_t uVar14;
  int64_t iVar15;
  undefined1 auVar16 [16];
  
  VVar5 = this->_pos;
  CVar4 = item->_cType;
  VVar3 = item->_valueType;
  pCVar6 = (this->_stack).
           super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((this->_stack).
       super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
       ._M_impl.super__Vector_impl_data._M_start != pCVar6) &&
     ((this->_start[pCVar6[-1].startPos] == '\x14' || (this->_start[pCVar6[-1].startPos] == '\v'))))
  {
    if ((this->_keyWritten != false) || ((VVar3 | Null) == String)) {
      this->_keyWritten = (bool)(this->_keyWritten ^ 1);
      goto code_r0x0010657d;
    }
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    EVar13 = BuilderKeyMustBeString;
    goto LAB_00106b0c;
  }
code_r0x0010657d:
  switch(VVar3) {
  case None:
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar12 = "Cannot set a ValueType::None";
    goto LAB_00106b20;
  case Illegal:
    reserve(this,1);
    VVar7 = this->_pos;
    this->_pos = VVar7 + 1;
    this->_start[VVar7] = '\x17';
    break;
  case Null:
    reserve(this,1);
    VVar7 = this->_pos;
    this->_pos = VVar7 + 1;
    this->_start[VVar7] = '\x18';
    break;
  case Bool:
    if (CVar4 != Bool) {
      set();
LAB_00106a79:
      set();
LAB_00106a7e:
      set();
LAB_00106a83:
      set();
      goto switchD_0010658d_caseD_10;
    }
    bVar8 = (item->_value).b;
    reserve(this,1);
    VVar7 = this->_pos;
    this->_pos = VVar7 + 1;
    this->_start[VVar7] = bVar8 + '\x19';
    break;
  case Array:
    bVar8 = Value::unindexed(item);
    uVar14 = '\x06';
    if (bVar8) {
      uVar14 = '\x13';
    }
    goto LAB_00106742;
  case Object:
    bVar8 = Value::unindexed(item);
    uVar14 = bVar8 * '\t' + '\v';
LAB_00106742:
    addCompoundValue(this,uVar14);
    goto switchD_0010658d_default;
  case Double:
    if (CVar4 == UInt64) {
      auVar16._0_8_ = (double)CONCAT44(0x43300000,(int)(item->_value).i);
      auVar16._8_4_ = (int)((ulong)(item->_value).i >> 0x20);
      auVar16._12_4_ = 0x45300000;
      VVar10.d = (auVar16._0_8_ - 4503599627370496.0) + (auVar16._8_8_ - 1.9342813113834067e+25);
    }
    else if (CVar4 == Int64) {
      VVar10.d = (double)(item->_value).i;
    }
    else {
      if (CVar4 != Double) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar12 = "Must give number for ValueType::Double";
        goto LAB_00106bc5;
      }
      VVar10 = item->_value;
    }
    reserve(this,9);
    VVar7 = this->_pos;
    this->_pos = VVar7 + 1;
    this->_start[VVar7] = '\x1b';
    pVVar1 = &this->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + 1;
    lVar9 = 8;
    do {
      VVar7 = this->_pos;
      this->_pos = VVar7 + 1;
      this->_start[VVar7] = VVar10.b;
      pVVar1 = &this->_bufferPtr->_size;
      *pVVar1 = *pVVar1 + 1;
      VVar10.u = VVar10.u >> 8;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    goto switchD_0010658d_default;
  case UTCDate:
    if ((CVar4 == UInt64) || (CVar4 == Int64)) {
      iVar15 = (item->_value).i;
LAB_0010688b:
      addUTCDate(this,iVar15);
      goto switchD_0010658d_default;
    }
    if (CVar4 == Double) {
      iVar15 = (int64_t)(item->_value).d;
      goto LAB_0010688b;
    }
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar12 = "Must give number for ValueType::UTCDate";
LAB_00106bc5:
    EVar13 = BuilderUnexpectedValue;
    goto LAB_00106bcd;
  case External:
    if (this->options->disallowExternals != true) {
      if (CVar4 == VoidPtr) {
        reserve(this,9);
        VVar7 = this->_pos;
        this->_pos = VVar7 + 1;
        this->_start[VVar7] = '\x1d';
        pVVar1 = &this->_bufferPtr->_size;
        *pVVar1 = *pVVar1 + 1;
        *(ValueUnion *)(this->_start + this->_pos) = item->_value;
        this->_pos = this->_pos + 8;
        pVVar1 = &this->_bufferPtr->_size;
        *pVVar1 = *pVVar1 + 8;
        goto switchD_0010658d_default;
      }
      goto LAB_00106a7e;
    }
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    EVar13 = BuilderExternalsDisallowed;
    goto LAB_00106b0c;
  case MinKey:
    reserve(this,1);
    VVar7 = this->_pos;
    this->_pos = VVar7 + 1;
    this->_start[VVar7] = '\x1e';
    break;
  case MaxKey:
    reserve(this,1);
    VVar7 = this->_pos;
    this->_pos = VVar7 + 1;
    this->_start[VVar7] = '\x1f';
    break;
  case Int:
    if ((CVar4 == UInt64) || (CVar4 == Int64)) {
      iVar15 = (item->_value).i;
    }
    else {
      if (CVar4 != Double) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar12 = "Must give number for ValueType::Int";
        goto LAB_00106bc5;
      }
      iVar15 = (int64_t)(item->_value).d;
    }
    addInt(this,iVar15);
    goto switchD_0010658d_default;
  case UInt:
    if (CVar4 == UInt64) {
LAB_001069ff:
      v_00 = (item->_value).u;
    }
    else {
      if (CVar4 != Int64) {
        if (CVar4 != Double) {
          this_00 = (Exception *)__cxa_allocate_exception(0x18);
          pcVar12 = "Must give number for ValueType::UInt";
          goto LAB_00106bc5;
        }
        dVar2 = (item->_value).d;
        if (0.0 <= dVar2) {
          v_00 = (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2;
          goto LAB_00106a03;
        }
        goto LAB_00106a83;
      }
      v_00 = (item->_value).u;
      if ((long)v_00 < 0) {
        set();
        goto LAB_001069ff;
      }
    }
LAB_00106a03:
    addUInt(this,v_00);
    goto switchD_0010658d_default;
  case SmallInt:
    if ((CVar4 == UInt64) || (CVar4 == Int64)) {
      iVar15 = (item->_value).i;
    }
    else {
      if (CVar4 != Double) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar12 = "Must give number for ValueType::SmallInt";
        goto LAB_00106bc5;
      }
      iVar15 = (int64_t)(item->_value).d;
    }
    if (iVar15 - 10U < 0xfffffffffffffff0) goto LAB_00106a79;
    reserve(this,1);
    VVar7 = this->_pos;
    this->_pos = VVar7 + 1;
    if (iVar15 < 0) {
      uVar14 = (char)iVar15 + '@';
    }
    else {
      uVar14 = (char)iVar15 + '0';
    }
    this->_start[VVar7] = uVar14;
    break;
  case String:
    if (CVar4 == StringView) {
      v = ((item->_value).sv)->_M_len;
      pcVar12 = ((item->_value).sv)->_M_str;
    }
    else if (CVar4 == CharPtr) {
      pcVar12 = (item->_value).c;
      v = strlen(pcVar12);
    }
    else {
      if (CVar4 != String) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar12 = "Must give a string or char const* for ValueType::String";
        goto LAB_00106bc5;
      }
      pcVar12 = (((item->_value).s)->_M_dataplus)._M_p;
      v = ((item->_value).s)->_M_string_length;
    }
    if (v < 0x7f) {
      reserve(this,v + 1);
      VVar7 = this->_pos;
      this->_pos = VVar7 + 1;
      this->_start[VVar7] = (char)v + '@';
      pVVar1 = &this->_bufferPtr->_size;
      *pVVar1 = *pVVar1 + 1;
    }
    else {
      reserve(this,v + 9);
      VVar7 = this->_pos;
      this->_pos = VVar7 + 1;
      this->_start[VVar7] = 0xbf;
      pVVar1 = &this->_bufferPtr->_size;
      *pVVar1 = *pVVar1 + 1;
      lVar9 = 8;
      uVar11 = v;
      do {
        VVar7 = this->_pos;
        this->_pos = VVar7 + 1;
        this->_start[VVar7] = (uint8_t)uVar11;
        pVVar1 = &this->_bufferPtr->_size;
        *pVVar1 = *pVVar1 + 1;
        uVar11 = uVar11 >> 8;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    if (v == 0) goto switchD_0010658d_default;
    goto LAB_00106a50;
  case Binary:
    if (CVar4 == String) {
      pcVar12 = (((item->_value).s)->_M_dataplus)._M_p;
      v = ((item->_value).s)->_M_string_length;
    }
    else if (CVar4 == CharPtr) {
      pcVar12 = (item->_value).c;
      v = strlen(pcVar12);
    }
    else {
      if (CVar4 != StringView) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar12 = "Must provide std::string, std::string_view or char const* for ValueType::Binary";
        goto LAB_00106bc5;
      }
      v = ((item->_value).sv)->_M_len;
      pcVar12 = ((item->_value).sv)->_M_str;
    }
    appendUInt(this,v,0xbf);
    if (v == 0) goto switchD_0010658d_default;
    reserve(this,v);
LAB_00106a50:
    memcpy(this->_start + this->_pos,pcVar12,v);
    this->_pos = this->_pos + v;
    pVVar1 = &this->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + v;
    goto switchD_0010658d_default;
  case BCD:
  case Tagged:
switchD_0010658d_caseD_10:
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    EVar13 = NotImplemented;
LAB_00106b0c:
    Exception::Exception(this_00,EVar13);
    goto LAB_00106bd2;
  case Custom:
    bVar8 = this->options->disallowCustom;
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    if (bVar8 == true) {
      EVar13 = BuilderCustomDisallowed;
      goto LAB_00106b0c;
    }
    pcVar12 = "Cannot set a ValueType::Custom with this method";
LAB_00106b20:
    EVar13 = BuilderUnexpectedType;
LAB_00106bcd:
    Exception::Exception(this_00,EVar13,pcVar12);
LAB_00106bd2:
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  default:
    goto switchD_0010658d_default;
  }
  pVVar1 = &this->_bufferPtr->_size;
  *pVVar1 = *pVVar1 + 1;
switchD_0010658d_default:
  return this->_start + VVar5;
}

Assistant:

uint8_t* Builder::set(Value const& item) {
  auto const oldPos = _pos;
  auto ctype = item.cType();

  checkKeyHasValidType(item.valueType() == ValueType::String ||
                       item.valueType() == ValueType::UInt);

  // This method builds a single further VPack item at the current
  // append position. If this is an array or object, then an index
  // table is created and a new ValueLength is pushed onto the stack.
  switch (item.valueType()) {
    case ValueType::Null: {
      appendByte(0x18);
      break;
    }
    case ValueType::Bool: {
      if (VELOCYPACK_UNLIKELY(ctype != Value::CType::Bool)) {
        throw Exception(Exception::BuilderUnexpectedValue,
                        "Must give bool for ValueType::Bool");
      }
      appendByte(item.getBool() ? 0x1a : 0x19);
      break;
    }
    case ValueType::Double: {
      static_assert(sizeof(double) == sizeof(uint64_t),
                    "size of double is not 8 bytes");
      double v = 0.0;
      uint64_t x;
      switch (ctype) {
        case Value::CType::Double:
          v = item.getDouble();
          break;
        case Value::CType::Int64:
          v = static_cast<double>(item.getInt64());
          break;
        case Value::CType::UInt64:
          v = static_cast<double>(item.getUInt64());
          break;
        default:
          throw Exception(Exception::BuilderUnexpectedValue,
                          "Must give number for ValueType::Double");
      }
      reserve(1 + sizeof(double));
      appendByteUnchecked(0x1b);
      std::memcpy(&x, &v, sizeof(double));
      appendLengthUnchecked<sizeof(double)>(x);
      break;
    }
    case ValueType::SmallInt: {
      int64_t vv = 0;
      switch (ctype) {
        case Value::CType::Double:
          vv = static_cast<int64_t>(item.getDouble());
          break;
        case Value::CType::Int64:
          vv = item.getInt64();
          break;
        case Value::CType::UInt64:
          vv = static_cast<int64_t>(item.getUInt64());
          break;
        default:
          throw Exception(Exception::BuilderUnexpectedValue,
                          "Must give number for ValueType::SmallInt");
      }
      if (VELOCYPACK_UNLIKELY(vv < -6 || vv > 9)) {
        throw Exception(Exception::NumberOutOfRange,
                        "Number out of range of ValueType::SmallInt");
      }
      if (vv >= 0) {
        appendByte(static_cast<uint8_t>(vv + 0x30));
      } else {
        appendByte(static_cast<uint8_t>(vv + 0x40));
      }
      break;
    }
    case ValueType::Int: {
      int64_t v;
      switch (ctype) {
        case Value::CType::Double:
          v = static_cast<int64_t>(item.getDouble());
          break;
        case Value::CType::Int64:
          v = item.getInt64();
          break;
        case Value::CType::UInt64:
          v = toInt64(item.getUInt64());
          break;
        default:
          throw Exception(Exception::BuilderUnexpectedValue,
                          "Must give number for ValueType::Int");
      }
      addInt(v);
      break;
    }
    case ValueType::UInt: {
      uint64_t v = 0;
      switch (ctype) {
        case Value::CType::Double:
          if (VELOCYPACK_UNLIKELY(item.getDouble() < 0.0)) {
            throw Exception(
                Exception::BuilderUnexpectedValue,
                "Must give non-negative number for ValueType::UInt");
          }
          v = static_cast<uint64_t>(item.getDouble());
          break;
        case Value::CType::Int64:
          if (VELOCYPACK_UNLIKELY(item.getInt64() < 0)) {
            throw Exception(
                Exception::BuilderUnexpectedValue,
                "Must give non-negative number for ValueType::UInt");
          }
          v = static_cast<uint64_t>(item.getInt64());
          break;
        case Value::CType::UInt64:
          v = item.getUInt64();
          break;
        default:
          throw Exception(Exception::BuilderUnexpectedValue,
                          "Must give number for ValueType::UInt");
      }
      addUInt(v);
      break;
    }
    case ValueType::String: {
      char const* p;
      std::size_t size;
      if (ctype == Value::CType::String) {
        std::string const* s = item.getString();
        size = s->size();
        p = s->data();
      } else if (ctype == Value::CType::CharPtr) {
        p = item.getCharPtr();
        size = strlen(p);
      } else if (ctype == Value::CType::StringView) {
        std::string_view const* sv = item.getStringView();
        size = sv->size();
        p = sv->data();
      } else {
        throw Exception(
            Exception::BuilderUnexpectedValue,
            "Must give a string or char const* for ValueType::String");
      }
      if (size <= 126) {
        // short string
        reserve(1 + size);
        appendByteUnchecked(static_cast<uint8_t>(0x40 + size));
      } else {
        // long string
        reserve(1 + 8 + size);
        appendByteUnchecked(0xbf);
        appendLengthUnchecked<8>(size);
      }
      if (size != 0) {
        VELOCYPACK_ASSERT(p != nullptr);
        std::memcpy(_start + _pos, p, size);
        advance(size);
      }
      break;
    }
    case ValueType::Array: {
      addArray(item.unindexed());
      break;
    }
    case ValueType::Object: {
      addObject(item.unindexed());
      break;
    }
    case ValueType::UTCDate: {
      int64_t v;
      switch (ctype) {
        case Value::CType::Double:
          v = static_cast<int64_t>(item.getDouble());
          break;
        case Value::CType::Int64:
          v = item.getInt64();
          break;
        case Value::CType::UInt64:
          v = toInt64(item.getUInt64());
          break;
        default:
          throw Exception(Exception::BuilderUnexpectedValue,
                          "Must give number for ValueType::UTCDate");
      }
      addUTCDate(v);
      break;
    }
    case ValueType::Binary: {
      if (VELOCYPACK_UNLIKELY(ctype != Value::CType::String &&
                              ctype != Value::CType::CharPtr &&
                              ctype != Value::CType::StringView)) {
        throw Exception(Exception::BuilderUnexpectedValue,
                        "Must provide std::string, std::string_view or char "
                        "const* for ValueType::Binary");
      }
      char const* p;
      ValueLength size;
      if (ctype == Value::CType::String) {
        p = item.getString()->data();
        size = item.getString()->size();
      } else if (ctype == Value::CType::StringView) {
        p = item.getStringView()->data();
        size = item.getStringView()->size();
      } else {
        p = item.getCharPtr();
        size = strlen(p);
      }
      appendUInt(size, 0xbf);
      if (size != 0) {
        reserve(size);
        VELOCYPACK_ASSERT(p != nullptr);
        std::memcpy(_start + _pos, p, checkOverflow(size));
        advance(size);
      }
      break;
    }
    case ValueType::External: {
      if (options->disallowExternals) {
        // External values explicitly disallowed as a security
        // precaution
        throw Exception(Exception::BuilderExternalsDisallowed);
      }
      if (VELOCYPACK_UNLIKELY(ctype != Value::CType::VoidPtr)) {
        throw Exception(Exception::BuilderUnexpectedValue,
                        "Must give void pointer for ValueType::External");
      }
      reserve(1 + sizeof(void*));
      // store pointer. this doesn't need to be portable
      appendByteUnchecked(0x1d);
      void const* value = item.getExternal();
      std::memcpy(_start + _pos, &value, sizeof(void*));
      advance(sizeof(void*));
      break;
    }
    case ValueType::Illegal: {
      appendByte(0x17);
      break;
    }
    case ValueType::MinKey: {
      appendByte(0x1e);
      break;
    }
    case ValueType::MaxKey: {
      appendByte(0x1f);
      break;
    }
    case ValueType::BCD: {
      throw Exception(Exception::NotImplemented);
    }
    case ValueType::Tagged: {
      throw Exception(Exception::NotImplemented);
    }
    case ValueType::Custom: {
      if (options->disallowCustom) {
        // Custom values explicitly disallowed as a security precaution
        throw Exception(Exception::BuilderCustomDisallowed);
      }
      throw Exception(Exception::BuilderUnexpectedType,
                      "Cannot set a ValueType::Custom with this method");
    }
    case ValueType::None: {
      throw Exception(Exception::BuilderUnexpectedType,
                      "Cannot set a ValueType::None");
    }
  }
  return _start + oldPos;
}